

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

FT_Int ps_parser_to_coord_array(PS_Parser parser,FT_Int max_coords,FT_Short *coords)

{
  FT_Int FVar1;
  FT_Short *coords_local;
  FT_Int max_coords_local;
  PS_Parser parser_local;
  
  ps_parser_skip_spaces(parser);
  FVar1 = ps_tocoordarray(&parser->cursor,parser->limit,max_coords,coords);
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Int )
  ps_parser_to_coord_array( PS_Parser  parser,
                            FT_Int     max_coords,
                            FT_Short*  coords )
  {
    ps_parser_skip_spaces( parser );
    return ps_tocoordarray( &parser->cursor, parser->limit,
                            max_coords, coords );
  }